

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-spawn.c
# Opt level: O1

int run_test_spawn_closed_process_io(void)

{
  int iVar1;
  __uid_t _Var2;
  uint uVar3;
  int extraout_EAX;
  undefined8 uVar4;
  anon_union_8_2_13e1ed65_for_data aVar5;
  uv_exit_cb p_Var6;
  uv_process_options_t *puVar7;
  passwd *ppVar8;
  int *piVar9;
  ulong uVar10;
  uv_process_options_t *__ptr;
  ulong uVar11;
  uv_buf_t *buf;
  undefined1 *nread;
  uv_stream_t *tcp;
  char *unaff_R12;
  uv_process_options_t *__s;
  char *unaff_R15;
  uv_process_options_t *__nmemb;
  undefined1 auVar12 [16];
  int64_t eval_b_1;
  int64_t eval_a_1;
  int64_t eval_b;
  uv_stdio_container_t stdio [2];
  uv_write_t write_req;
  uv_pipe_t in;
  undefined1 auStack_bf0 [48];
  uv_handle_t *apuStack_bc0 [11];
  uv_loop_t *puStack_b68;
  undefined8 auStack_a00 [29];
  uv_stdio_container_t uStack_918;
  undefined4 uStack_908;
  undefined4 uStack_8f8;
  anon_union_8_2_13e1ed65_for_data aStack_8e0;
  long lStack_8a8;
  int iStack_8a0;
  int iStack_89c;
  undefined1 auStack_898 [16];
  undefined8 uStack_888;
  undefined2 uStack_880;
  uv_stdio_container_t uStack_878;
  long alStack_868 [25];
  long alStack_7a0 [25];
  uv_exit_cb ap_Stack_6d8 [29];
  undefined1 auStack_5f0 [88];
  int iStack_598;
  anon_union_8_2_13e1ed65_for_data aStack_430;
  uv_process_options_t *puStack_428;
  long lStack_420;
  long lStack_418;
  anon_union_8_2_13e1ed65_for_data aStack_410;
  char cStack_3f9;
  long lStack_3f8;
  long lStack_3f0;
  anon_union_8_2_13e1ed65_for_data aStack_3e8;
  uv_process_options_t *puStack_3e0;
  uv_process_options_t *apuStack_3d8 [2];
  uv_process_options_t *puStack_3c8;
  cpu_set_t cStack_3c0;
  anon_union_8_2_13e1ed65_for_data aStack_338;
  char *pcStack_330;
  uv_process_options_t *puStack_328;
  code *pcStack_320;
  long lStack_318;
  long lStack_310;
  anon_union_8_2_13e1ed65_for_data aStack_308;
  long lStack_300;
  long lStack_2f8;
  anon_union_8_2_13e1ed65_for_data aStack_2f0;
  long lStack_2e8;
  long lStack_2e0;
  char acStack_2ca [10];
  anon_union_8_2_13e1ed65_for_data aStack_2c0;
  sigset_t sStack_290;
  anon_union_8_2_13e1ed65_for_data aStack_210;
  long local_208;
  long local_200;
  undefined1 local_1f8 [16];
  uv_stdio_container_t local_1e8 [2];
  long local_1c0 [25];
  undefined1 local_f8 [232];
  
  aStack_210 = (anon_union_8_2_13e1ed65_for_data)0x1c1c04;
  init_process_options("spawn_helper3",exit_cb);
  aStack_210 = (anon_union_8_2_13e1ed65_for_data)0x1c1c09;
  uVar4 = uv_default_loop();
  aVar5.stream = (uv_stream_t *)local_f8;
  aStack_210 = (anon_union_8_2_13e1ed65_for_data)0x1c1c1e;
  uv_pipe_init(uVar4,aVar5.stream,0);
  options.stdio = local_1e8;
  __s = &options;
  local_1e8[0].flags = UV_READABLE_PIPE|UV_CREATE_PIPE;
  options.stdio_count = 1;
  aStack_210 = (anon_union_8_2_13e1ed65_for_data)0x1c1c4c;
  local_1e8[0].data.stream = aVar5.stream;
  close(0);
  aStack_210 = (anon_union_8_2_13e1ed65_for_data)0x1c1c51;
  uVar4 = uv_default_loop();
  aStack_210 = (anon_union_8_2_13e1ed65_for_data)0x1c1c63;
  iVar1 = uv_spawn(uVar4,&process,&options);
  local_1c0[0] = (long)iVar1;
  local_1f8._0_8_ = 0;
  if (local_1c0[0] == 0) {
    aStack_210 = (anon_union_8_2_13e1ed65_for_data)0x1c1c94;
    local_1f8 = uv_buf_init(run_test_spawn_closed_process_io::buffer,0x18);
    aStack_210 = (anon_union_8_2_13e1ed65_for_data)0x1c1cc1;
    iVar1 = uv_write(local_1c0,local_f8,local_1f8,1,write_cb);
    local_200 = (long)iVar1;
    local_208 = 0;
    if (local_200 != 0) goto LAB_001c1dbd;
    aStack_210 = (anon_union_8_2_13e1ed65_for_data)0x1c1ce4;
    uVar4 = uv_default_loop();
    aStack_210 = (anon_union_8_2_13e1ed65_for_data)0x1c1cee;
    iVar1 = uv_run(uVar4,0);
    local_200 = (long)iVar1;
    local_208 = 0;
    if (local_200 != 0) goto LAB_001c1dca;
    local_200 = 1;
    local_208 = (long)exit_cb_called;
    if (local_208 != 1) goto LAB_001c1dd7;
    local_200 = 2;
    local_208 = (long)close_cb_called;
    if (local_208 != 2) goto LAB_001c1de4;
    aStack_210 = (anon_union_8_2_13e1ed65_for_data)0x1c1d57;
    aVar5.stream = (uv_stream_t *)uv_default_loop();
    aStack_210 = (anon_union_8_2_13e1ed65_for_data)0x1c1d6b;
    uv_walk(aVar5.stream,close_walk_cb,0);
    aStack_210 = (anon_union_8_2_13e1ed65_for_data)0x1c1d75;
    uv_run(aVar5.stream,0);
    local_200 = 0;
    aStack_210 = (anon_union_8_2_13e1ed65_for_data)0x1c1d83;
    uVar4 = uv_default_loop();
    aStack_210 = (anon_union_8_2_13e1ed65_for_data)0x1c1d8b;
    iVar1 = uv_loop_close(uVar4);
    local_208 = (long)iVar1;
    if (local_200 == local_208) {
      aStack_210 = (anon_union_8_2_13e1ed65_for_data)0x1c1da1;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    aStack_210 = (anon_union_8_2_13e1ed65_for_data)0x1c1dbd;
    run_test_spawn_closed_process_io_cold_1();
LAB_001c1dbd:
    aStack_210 = (anon_union_8_2_13e1ed65_for_data)0x1c1dca;
    run_test_spawn_closed_process_io_cold_2();
LAB_001c1dca:
    aStack_210 = (anon_union_8_2_13e1ed65_for_data)0x1c1dd7;
    run_test_spawn_closed_process_io_cold_3();
LAB_001c1dd7:
    aStack_210 = (anon_union_8_2_13e1ed65_for_data)0x1c1de4;
    run_test_spawn_closed_process_io_cold_4();
LAB_001c1de4:
    aStack_210 = (anon_union_8_2_13e1ed65_for_data)0x1c1df1;
    run_test_spawn_closed_process_io_cold_5();
  }
  aStack_210.stream = (uv_stream_t *)run_test_kill;
  run_test_spawn_closed_process_io_cold_6();
  aStack_210 = aVar5;
  init_process_options("spawn_helper4",kill_cb);
  sigemptyset(&sStack_290);
  sigaddset(&sStack_290,0xf);
  iVar1 = pthread_sigmask(0,&sStack_290,(__sigset_t *)0x0);
  if (iVar1 == 0) {
    sStack_290.__val[0] = 0xffffffffffffffff;
    p_Var6 = (uv_exit_cb)signal(0xf,(__sighandler_t)0x1);
    if ((uv_exit_cb)sStack_290.__val[0] == p_Var6) goto LAB_001c2067;
    uVar4 = uv_default_loop();
    iVar1 = uv_spawn(uVar4,&process,&options);
    sStack_290.__val[0] = (ulong)iVar1;
    if ((uv_exit_cb)sStack_290.__val[0] != (uv_exit_cb)0x0) goto LAB_001c2074;
    sigemptyset(&sStack_290);
    sigaddset(&sStack_290,0xf);
    iVar1 = pthread_sigmask(1,&sStack_290,(__sigset_t *)0x0);
    if (iVar1 != 0) goto LAB_001c2081;
    sStack_290.__val[0] = 0xffffffffffffffff;
    p_Var6 = (uv_exit_cb)signal(0xf,(__sighandler_t)0x0);
    if ((uv_exit_cb)sStack_290.__val[0] == p_Var6) goto LAB_001c208e;
    iVar1 = uv_kill(process.pid,0);
    sStack_290.__val[0] = (ulong)iVar1;
    if ((uv_exit_cb)sStack_290.__val[0] != (uv_exit_cb)0x0) goto LAB_001c209b;
    iVar1 = uv_kill(process.pid,0xf);
    sStack_290.__val[0] = (ulong)iVar1;
    if ((uv_exit_cb)sStack_290.__val[0] != (uv_exit_cb)0x0) goto LAB_001c20a8;
    uVar4 = uv_default_loop();
    iVar1 = uv_run(uVar4,0);
    sStack_290.__val[0] = (ulong)iVar1;
    if ((uv_exit_cb)sStack_290.__val[0] != (uv_exit_cb)0x0) goto LAB_001c20b5;
    sStack_290.__val[0] = 1;
    if (exit_cb_called != 1) goto LAB_001c20c2;
    sStack_290.__val[0] = 1;
    if (close_cb_called != 1) goto LAB_001c20cf;
    puVar7 = (uv_process_options_t *)uv_default_loop();
    uv_walk(puVar7,close_walk_cb,0);
    uv_run(puVar7,0);
    sStack_290.__val[0] = 0;
    uVar4 = uv_default_loop();
    iVar1 = uv_loop_close(uVar4);
    if ((uv_exit_cb)sStack_290.__val[0] == (uv_exit_cb)(long)iVar1) {
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    run_test_kill_cold_1();
LAB_001c2067:
    run_test_kill_cold_11();
LAB_001c2074:
    run_test_kill_cold_2();
LAB_001c2081:
    run_test_kill_cold_3();
LAB_001c208e:
    run_test_kill_cold_10();
LAB_001c209b:
    run_test_kill_cold_4();
LAB_001c20a8:
    run_test_kill_cold_5();
LAB_001c20b5:
    run_test_kill_cold_6();
LAB_001c20c2:
    run_test_kill_cold_7();
LAB_001c20cf:
    puVar7 = (uv_process_options_t *)&sStack_290;
    run_test_kill_cold_8();
  }
  run_test_kill_cold_9();
  aStack_2f0 = (anon_union_8_2_13e1ed65_for_data)0x1c20f9;
  aStack_2c0 = (anon_union_8_2_13e1ed65_for_data)puVar7;
  _Var2 = getuid();
  if (_Var2 != 0) {
    aStack_2f0 = (anon_union_8_2_13e1ed65_for_data)0x1c22b8;
    run_test_spawn_setuid_setgid_cold_1();
    return 7;
  }
  aStack_2f0 = (anon_union_8_2_13e1ed65_for_data)0x1c2114;
  init_process_options("spawn_helper_setuid_setgid",exit_cb);
  aStack_2f0 = (anon_union_8_2_13e1ed65_for_data)0x1c2120;
  ppVar8 = getpwnam("nobody");
  if (ppVar8 == (passwd *)0x0) {
    aStack_2f0 = (anon_union_8_2_13e1ed65_for_data)0x1c22cb;
    run_test_spawn_setuid_setgid_cold_8();
LAB_001c22cb:
    aStack_2f0 = (anon_union_8_2_13e1ed65_for_data)0x1c22d8;
    run_test_spawn_setuid_setgid_cold_2();
LAB_001c22d8:
    aStack_2f0 = (anon_union_8_2_13e1ed65_for_data)0x1c22e5;
    run_test_spawn_setuid_setgid_cold_3();
LAB_001c22e5:
    aStack_2f0 = (anon_union_8_2_13e1ed65_for_data)0x1c22f2;
    run_test_spawn_setuid_setgid_cold_4();
LAB_001c22f2:
    aStack_2f0 = (anon_union_8_2_13e1ed65_for_data)0x1c22ff;
    run_test_spawn_setuid_setgid_cold_5();
  }
  else {
    options.uid = ppVar8->pw_uid;
    puVar7 = &options;
    options.gid = ppVar8->pw_gid;
    unaff_R15 = "%d";
    unaff_R12 = acStack_2ca;
    aStack_2f0 = (anon_union_8_2_13e1ed65_for_data)0x1c2168;
    snprintf(unaff_R12,10,"%d",(ulong)ppVar8->pw_uid);
    __s = (uv_process_options_t *)&stack0xfffffffffffffd2c;
    aStack_2f0 = (anon_union_8_2_13e1ed65_for_data)0x1c2183;
    snprintf((char *)__s,10,"%d",(ulong)ppVar8->pw_gid);
    options.args[2] = unaff_R12;
    options.args[3] = (char *)__s;
    options.flags = 3;
    aStack_2f0 = (anon_union_8_2_13e1ed65_for_data)0x1c21a8;
    uVar4 = uv_default_loop();
    aStack_2f0 = (anon_union_8_2_13e1ed65_for_data)0x1c21ba;
    iVar1 = uv_spawn(uVar4,&process,&options);
    if (iVar1 == -0xd) {
      aStack_2f0 = (anon_union_8_2_13e1ed65_for_data)0x1c22bf;
      run_test_spawn_setuid_setgid_cold_7();
      return 7;
    }
    lStack_2e0 = (long)iVar1;
    lStack_2e8 = 0;
    if (lStack_2e0 != 0) goto LAB_001c22cb;
    aStack_2f0 = (anon_union_8_2_13e1ed65_for_data)0x1c21e6;
    uVar4 = uv_default_loop();
    aStack_2f0 = (anon_union_8_2_13e1ed65_for_data)0x1c21f0;
    iVar1 = uv_run(uVar4,0);
    lStack_2e0 = (long)iVar1;
    lStack_2e8 = 0;
    if (lStack_2e0 != 0) goto LAB_001c22d8;
    lStack_2e0 = 1;
    lStack_2e8 = (long)exit_cb_called;
    if (lStack_2e8 != 1) goto LAB_001c22e5;
    lStack_2e0 = 1;
    lStack_2e8 = (long)close_cb_called;
    if (lStack_2e8 != 1) goto LAB_001c22f2;
    aStack_2f0 = (anon_union_8_2_13e1ed65_for_data)0x1c2259;
    __s = (uv_process_options_t *)uv_default_loop();
    puVar7 = (uv_process_options_t *)0x0;
    aStack_2f0 = (anon_union_8_2_13e1ed65_for_data)0x1c226f;
    uv_walk(__s,close_walk_cb,0);
    aStack_2f0 = (anon_union_8_2_13e1ed65_for_data)0x1c2279;
    uv_run(__s,0);
    lStack_2e0 = 0;
    aStack_2f0 = (anon_union_8_2_13e1ed65_for_data)0x1c2287;
    uVar4 = uv_default_loop();
    aStack_2f0 = (anon_union_8_2_13e1ed65_for_data)0x1c228f;
    iVar1 = uv_loop_close(uVar4);
    lStack_2e8 = (long)iVar1;
    if (lStack_2e0 == lStack_2e8) {
      aStack_2f0 = (anon_union_8_2_13e1ed65_for_data)0x1c22a5;
      uv_library_shutdown();
      return 0;
    }
  }
  aStack_2f0.stream = (uv_stream_t *)run_test_spawn_setuid_fails;
  run_test_spawn_setuid_setgid_cold_6();
  aStack_308 = (anon_union_8_2_13e1ed65_for_data)0x1c2316;
  aStack_2f0 = (anon_union_8_2_13e1ed65_for_data)puVar7;
  _Var2 = getuid();
  if (_Var2 == 0) {
    aStack_308 = (anon_union_8_2_13e1ed65_for_data)0x1c2326;
    aVar5.stream = (uv_stream_t *)getpwnam("nobody");
    if (aVar5.stream == (uv_stream_t *)0x0) goto LAB_001c24b5;
    aStack_308 = (anon_union_8_2_13e1ed65_for_data)0x1c233a;
    iVar1 = setgid(*(__gid_t *)&(aVar5.stream)->field_0x14);
    lStack_2f8 = (long)iVar1;
    lStack_300 = 0;
    puVar7 = (uv_process_options_t *)aVar5.stream;
    if (lStack_2f8 != 0) goto LAB_001c24ba;
    aStack_308 = (anon_union_8_2_13e1ed65_for_data)0x1c2360;
    iVar1 = setuid((aVar5.stream)->type);
    lStack_2f8 = (long)iVar1;
    lStack_300 = 0;
    if (lStack_2f8 == 0) goto LAB_001c237e;
  }
  else {
LAB_001c237e:
    aStack_308 = (anon_union_8_2_13e1ed65_for_data)0x1c2391;
    init_process_options("spawn_helper1",fail_cb);
    puVar7 = &options;
    options.uid = 0;
    options.flags = options.flags | 0x75;
    aStack_308 = (anon_union_8_2_13e1ed65_for_data)0x1c23ae;
    uVar4 = uv_default_loop();
    aStack_308 = (anon_union_8_2_13e1ed65_for_data)0x1c23c0;
    iVar1 = uv_spawn(uVar4,&process,&options);
    lStack_2f8 = (long)iVar1;
    lStack_300 = -1;
    if (lStack_2f8 == -1) {
      aStack_308 = (anon_union_8_2_13e1ed65_for_data)0x1c23e3;
      uVar4 = uv_default_loop();
      aStack_308 = (anon_union_8_2_13e1ed65_for_data)0x1c23ed;
      iVar1 = uv_run(uVar4,0);
      lStack_2f8 = (long)iVar1;
      lStack_300 = 0;
      if (lStack_2f8 != 0) goto LAB_001c248e;
      lStack_2f8 = (long)close_cb_called;
      lStack_300 = 0;
      if (lStack_2f8 != 0) goto LAB_001c249b;
      aStack_308 = (anon_union_8_2_13e1ed65_for_data)0x1c242f;
      puVar7 = (uv_process_options_t *)uv_default_loop();
      aStack_308 = (anon_union_8_2_13e1ed65_for_data)0x1c2443;
      uv_walk(puVar7,close_walk_cb,0);
      aStack_308 = (anon_union_8_2_13e1ed65_for_data)0x1c244d;
      uv_run(puVar7,0);
      lStack_2f8 = 0;
      aStack_308 = (anon_union_8_2_13e1ed65_for_data)0x1c245b;
      uVar4 = uv_default_loop();
      aStack_308 = (anon_union_8_2_13e1ed65_for_data)0x1c2463;
      iVar1 = uv_loop_close(uVar4);
      lStack_300 = (long)iVar1;
      if (lStack_2f8 == lStack_300) {
        aStack_308 = (anon_union_8_2_13e1ed65_for_data)0x1c2479;
        uv_library_shutdown();
        return 0;
      }
    }
    else {
      aStack_308 = (anon_union_8_2_13e1ed65_for_data)0x1c248e;
      run_test_spawn_setuid_fails_cold_3();
LAB_001c248e:
      aStack_308 = (anon_union_8_2_13e1ed65_for_data)0x1c249b;
      run_test_spawn_setuid_fails_cold_4();
LAB_001c249b:
      aStack_308 = (anon_union_8_2_13e1ed65_for_data)0x1c24a8;
      run_test_spawn_setuid_fails_cold_5();
    }
    aStack_308 = (anon_union_8_2_13e1ed65_for_data)0x1c24b5;
    run_test_spawn_setuid_fails_cold_6();
LAB_001c24b5:
    aStack_308 = (anon_union_8_2_13e1ed65_for_data)0x1c24ba;
    run_test_spawn_setuid_fails_cold_7();
LAB_001c24ba:
    aStack_308 = (anon_union_8_2_13e1ed65_for_data)0x1c24c7;
    run_test_spawn_setuid_fails_cold_1();
  }
  aStack_308.stream = (uv_stream_t *)run_test_spawn_setgid_fails;
  run_test_spawn_setuid_fails_cold_2();
  pcStack_320 = (code *)0x1c24de;
  aStack_308 = (anon_union_8_2_13e1ed65_for_data)puVar7;
  _Var2 = getuid();
  if (_Var2 == 0) {
    pcStack_320 = (code *)0x1c24ee;
    aVar5.stream = (uv_stream_t *)getpwnam("nobody");
    if (aVar5.stream == (uv_stream_t *)0x0) goto LAB_001c267d;
    pcStack_320 = (code *)0x1c2502;
    iVar1 = setgid(*(__gid_t *)&(aVar5.stream)->field_0x14);
    lStack_310 = (long)iVar1;
    lStack_318 = 0;
    puVar7 = (uv_process_options_t *)aVar5.stream;
    if (lStack_310 != 0) goto LAB_001c2682;
    pcStack_320 = (code *)0x1c2528;
    iVar1 = setuid((aVar5.stream)->type);
    lStack_310 = (long)iVar1;
    lStack_318 = 0;
    if (lStack_310 == 0) goto LAB_001c2546;
  }
  else {
LAB_001c2546:
    pcStack_320 = (code *)0x1c2559;
    init_process_options("spawn_helper1",fail_cb);
    puVar7 = &options;
    options.flags = options.flags | 2;
    options.gid = 0;
    pcStack_320 = (code *)0x1c2576;
    uVar4 = uv_default_loop();
    pcStack_320 = (code *)0x1c2588;
    iVar1 = uv_spawn(uVar4,&process,&options);
    lStack_310 = (long)iVar1;
    lStack_318 = -1;
    if (lStack_310 == -1) {
      pcStack_320 = (code *)0x1c25ab;
      uVar4 = uv_default_loop();
      pcStack_320 = (code *)0x1c25b5;
      iVar1 = uv_run(uVar4,0);
      lStack_310 = (long)iVar1;
      lStack_318 = 0;
      if (lStack_310 != 0) goto LAB_001c2656;
      lStack_310 = (long)close_cb_called;
      lStack_318 = 0;
      if (lStack_310 != 0) goto LAB_001c2663;
      pcStack_320 = (code *)0x1c25f7;
      puVar7 = (uv_process_options_t *)uv_default_loop();
      pcStack_320 = (code *)0x1c260b;
      uv_walk(puVar7,close_walk_cb,0);
      pcStack_320 = (code *)0x1c2615;
      uv_run(puVar7,0);
      lStack_310 = 0;
      pcStack_320 = (code *)0x1c2623;
      uVar4 = uv_default_loop();
      pcStack_320 = (code *)0x1c262b;
      iVar1 = uv_loop_close(uVar4);
      lStack_318 = (long)iVar1;
      if (lStack_310 == lStack_318) {
        pcStack_320 = (code *)0x1c2641;
        uv_library_shutdown();
        return 0;
      }
    }
    else {
      pcStack_320 = (code *)0x1c2656;
      run_test_spawn_setgid_fails_cold_3();
LAB_001c2656:
      pcStack_320 = (code *)0x1c2663;
      run_test_spawn_setgid_fails_cold_4();
LAB_001c2663:
      pcStack_320 = (code *)0x1c2670;
      run_test_spawn_setgid_fails_cold_5();
    }
    pcStack_320 = (code *)0x1c267d;
    run_test_spawn_setgid_fails_cold_6();
LAB_001c267d:
    pcStack_320 = (code *)0x1c2682;
    run_test_spawn_setgid_fails_cold_7();
LAB_001c2682:
    pcStack_320 = (code *)0x1c268f;
    run_test_spawn_setgid_fails_cold_1();
  }
  pcStack_320 = run_test_spawn_affinity;
  run_test_spawn_setgid_fails_cold_2();
  aStack_3e8 = (anon_union_8_2_13e1ed65_for_data)0x1c26af;
  aStack_338 = (anon_union_8_2_13e1ed65_for_data)puVar7;
  pcStack_330 = unaff_R12;
  puStack_328 = __s;
  pcStack_320 = (code *)unaff_R15;
  uVar3 = uv_cpumask_size();
  if ((int)uVar3 < 1) {
    aStack_3e8 = (anon_union_8_2_13e1ed65_for_data)0x1c28a4;
    run_test_spawn_affinity_cold_1();
LAB_001c28a4:
    aStack_3e8 = (anon_union_8_2_13e1ed65_for_data)0x1c28b1;
    run_test_spawn_affinity_cold_2();
LAB_001c28b1:
    aStack_3e8 = (anon_union_8_2_13e1ed65_for_data)0x1c28be;
    run_test_spawn_affinity_cold_3();
LAB_001c28be:
    __ptr = puVar7;
    aStack_3e8 = (anon_union_8_2_13e1ed65_for_data)0x1c28c3;
    run_test_spawn_affinity_cold_9();
LAB_001c28c3:
    aStack_3e8 = (anon_union_8_2_13e1ed65_for_data)0x1c28c8;
    run_test_spawn_affinity_cold_4();
LAB_001c28c8:
    aStack_3e8 = (anon_union_8_2_13e1ed65_for_data)0x1c28cd;
    run_test_spawn_affinity_cold_5();
LAB_001c28cd:
    aStack_3e8 = (anon_union_8_2_13e1ed65_for_data)0x1c28d2;
    run_test_spawn_affinity_cold_6();
LAB_001c28d2:
    aStack_3e8 = (anon_union_8_2_13e1ed65_for_data)0x1c28d7;
    run_test_spawn_affinity_cold_7();
  }
  else {
    puVar7._4_4_ = 0;
    puVar7._0_4_ = uVar3;
    cStack_3c0.__bits[0xe] = 0;
    cStack_3c0.__bits[0xf] = 0;
    cStack_3c0.__bits[0xc] = 0;
    cStack_3c0.__bits[0xd] = 0;
    cStack_3c0.__bits[10] = 0;
    cStack_3c0.__bits[0xb] = 0;
    cStack_3c0.__bits[8] = 0;
    cStack_3c0.__bits[9] = 0;
    cStack_3c0.__bits[6] = 0;
    cStack_3c0.__bits[7] = 0;
    cStack_3c0.__bits[4] = 0;
    cStack_3c0.__bits[5] = 0;
    cStack_3c0.__bits[2] = 0;
    cStack_3c0.__bits[3] = 0;
    cStack_3c0.__bits[0] = 0;
    cStack_3c0.__bits[1] = 0;
    __s = (uv_process_options_t *)0x0;
    aStack_3e8 = (anon_union_8_2_13e1ed65_for_data)0x1c26ef;
    iVar1 = sched_getaffinity(0,0x80,&cStack_3c0);
    if (iVar1 != 0) {
      aStack_3e8 = (anon_union_8_2_13e1ed65_for_data)0x1c26f8;
      piVar9 = __errno_location();
      __s = (uv_process_options_t *)(long)*piVar9;
    }
    puStack_3e0 = (uv_process_options_t *)0x0;
    apuStack_3d8[0] = __s;
    if (__s != (uv_process_options_t *)0x0) goto LAB_001c28a4;
    uVar11 = 1;
    if (1 < (int)uVar3) {
      uVar11 = (ulong)uVar3;
    }
    uVar10 = 0;
    do {
      if ((uVar10 < 0x400) && ((cStack_3c0.__bits[uVar10 >> 6] >> (uVar10 & 0x3f) & 1) != 0))
      goto LAB_001c2748;
      uVar10 = uVar10 + 1;
    } while (uVar11 != uVar10);
    uVar10 = (ulong)uVar3;
LAB_001c2748:
    __s = (uv_process_options_t *)(uVar10 & 0xffffffff);
    __nmemb = (uv_process_options_t *)(ulong)uVar3;
    puStack_3e0 = __nmemb;
    apuStack_3d8[0] = __s;
    if (__nmemb <= __s) goto LAB_001c28b1;
    aStack_3e8 = (anon_union_8_2_13e1ed65_for_data)0x1c2784;
    snprintf((char *)apuStack_3d8,0xb,"%d",__s);
    aStack_3e8 = (anon_union_8_2_13e1ed65_for_data)0x1c2797;
    init_process_options("spawn_helper_affinity",exit_cb);
    aStack_3e8 = (anon_union_8_2_13e1ed65_for_data)0x1c27a4;
    __ptr = (uv_process_options_t *)calloc((size_t)__nmemb,1);
    if ((uv_stream_t *)__ptr == (uv_stream_t *)0x0) goto LAB_001c28be;
    *(char *)((long)&__s->exit_cb + (long)&((uv_stream_t *)__ptr)->data) = '\x01';
    __s = &options;
    options.cpumask = (char *)__ptr;
    options.cpumask_size = (size_t)__nmemb;
    options.args[2] = (char *)apuStack_3d8;
    options.args[3] = "dummy";
    aStack_3e8 = (anon_union_8_2_13e1ed65_for_data)0x1c27ec;
    uVar4 = uv_default_loop();
    aStack_3e8 = (anon_union_8_2_13e1ed65_for_data)0x1c27fe;
    iVar1 = uv_spawn(uVar4,&process,&options);
    if (iVar1 != 0) goto LAB_001c28c3;
    aStack_3e8 = (anon_union_8_2_13e1ed65_for_data)0x1c280b;
    uVar4 = uv_default_loop();
    aStack_3e8 = (anon_union_8_2_13e1ed65_for_data)0x1c2815;
    iVar1 = uv_run(uVar4,0);
    if (iVar1 != 0) goto LAB_001c28c8;
    if (exit_cb_called != 1) goto LAB_001c28cd;
    if (close_cb_called != 1) goto LAB_001c28d2;
    aStack_3e8 = (anon_union_8_2_13e1ed65_for_data)0x1c283f;
    free(__ptr);
    aStack_3e8 = (anon_union_8_2_13e1ed65_for_data)0x1c2844;
    __ptr = (uv_process_options_t *)uv_default_loop();
    aStack_3e8 = (anon_union_8_2_13e1ed65_for_data)0x1c2858;
    uv_walk(__ptr,close_walk_cb,0);
    aStack_3e8 = (anon_union_8_2_13e1ed65_for_data)0x1c2862;
    uv_run(__ptr,0);
    puStack_3e0 = (uv_process_options_t *)0x0;
    aStack_3e8 = (anon_union_8_2_13e1ed65_for_data)0x1c286f;
    uVar4 = uv_default_loop();
    aStack_3e8 = (anon_union_8_2_13e1ed65_for_data)0x1c2877;
    iVar1 = uv_loop_close(uVar4);
    puStack_3c8 = (uv_process_options_t *)(long)iVar1;
    if (puStack_3e0 == puStack_3c8) {
      aStack_3e8 = (anon_union_8_2_13e1ed65_for_data)0x1c288e;
      uv_library_shutdown();
      return 0;
    }
  }
  aStack_3e8.stream = (uv_stream_t *)run_test_spawn_affinity_invalid_mask;
  run_test_spawn_affinity_cold_8();
  aStack_410 = (anon_union_8_2_13e1ed65_for_data)0x1c28ee;
  aStack_3e8 = (anon_union_8_2_13e1ed65_for_data)__ptr;
  iVar1 = uv_cpumask_size();
  if (iVar1 < 1) {
    aStack_410 = (anon_union_8_2_13e1ed65_for_data)0x1c29ad;
    run_test_spawn_affinity_invalid_mask_cold_1();
LAB_001c29ad:
    aStack_410 = (anon_union_8_2_13e1ed65_for_data)0x1c29b2;
    run_test_spawn_affinity_invalid_mask_cold_2();
LAB_001c29b2:
    aStack_410 = (anon_union_8_2_13e1ed65_for_data)0x1c29b7;
    run_test_spawn_affinity_invalid_mask_cold_3();
  }
  else {
    aStack_410 = (anon_union_8_2_13e1ed65_for_data)0x1c2909;
    init_process_options("",exit_cb);
    options.cpumask = &cStack_3f9;
    cStack_3f9 = '\0';
    options.cpumask_size = 0;
    __ptr = &options;
    aStack_410 = (anon_union_8_2_13e1ed65_for_data)0x1c292f;
    uVar4 = uv_default_loop();
    aStack_410 = (anon_union_8_2_13e1ed65_for_data)0x1c2941;
    iVar1 = uv_spawn(uVar4,&process,&options);
    if (iVar1 != -0x16) goto LAB_001c29ad;
    if (exit_cb_called != 0) goto LAB_001c29b2;
    aStack_410 = (anon_union_8_2_13e1ed65_for_data)0x1c2954;
    __ptr = (uv_process_options_t *)uv_default_loop();
    aStack_410 = (anon_union_8_2_13e1ed65_for_data)0x1c2968;
    uv_walk(__ptr,close_walk_cb,0);
    aStack_410 = (anon_union_8_2_13e1ed65_for_data)0x1c2972;
    uv_run(__ptr,0);
    lStack_3f0 = 0;
    aStack_410 = (anon_union_8_2_13e1ed65_for_data)0x1c2980;
    uVar4 = uv_default_loop();
    aStack_410 = (anon_union_8_2_13e1ed65_for_data)0x1c2988;
    iVar1 = uv_loop_close(uVar4);
    lStack_3f8 = (long)iVar1;
    if (lStack_3f0 == lStack_3f8) {
      aStack_410 = (anon_union_8_2_13e1ed65_for_data)0x1c29a0;
      uv_library_shutdown();
      return 0;
    }
  }
  aStack_410.stream = (uv_stream_t *)run_test_spawn_auto_unref;
  run_test_spawn_affinity_invalid_mask_cold_4();
  puStack_428 = (uv_process_options_t *)0x1c29d9;
  aStack_410 = (anon_union_8_2_13e1ed65_for_data)__ptr;
  init_process_options("spawn_helper1",(uv_exit_cb)0x0);
  puStack_428 = (uv_process_options_t *)0x1c29de;
  uVar4 = uv_default_loop();
  puStack_428 = (uv_process_options_t *)0x1c29f4;
  iVar1 = uv_spawn(uVar4,&process,&options);
  lStack_418 = (long)iVar1;
  lStack_420 = 0;
  if (lStack_418 == 0) {
    puStack_428 = (uv_process_options_t *)0x1c2a17;
    uVar4 = uv_default_loop();
    puStack_428 = (uv_process_options_t *)0x1c2a21;
    iVar1 = uv_run(uVar4,0);
    lStack_418 = (long)iVar1;
    lStack_420 = 0;
    if (lStack_418 != 0) goto LAB_001c2b32;
    puStack_428 = (uv_process_options_t *)0x1c2a4b;
    iVar1 = uv_is_closing(&process);
    lStack_418 = (long)iVar1;
    lStack_420 = 0;
    if (lStack_418 != 0) goto LAB_001c2b3f;
    puStack_428 = (uv_process_options_t *)0x1c2a77;
    uv_close(&process,0);
    puStack_428 = (uv_process_options_t *)0x1c2a7c;
    uVar4 = uv_default_loop();
    puStack_428 = (uv_process_options_t *)0x1c2a86;
    iVar1 = uv_run(uVar4,0);
    lStack_418 = (long)iVar1;
    lStack_420 = 0;
    if (lStack_418 != 0) goto LAB_001c2b4c;
    lStack_418 = 1;
    puStack_428 = (uv_process_options_t *)0x1c2ab9;
    iVar1 = uv_is_closing(&process);
    lStack_420 = (long)iVar1;
    if (lStack_418 != lStack_420) goto LAB_001c2b59;
    puStack_428 = (uv_process_options_t *)0x1c2ad3;
    __ptr = (uv_process_options_t *)uv_default_loop();
    puStack_428 = (uv_process_options_t *)0x1c2ae7;
    uv_walk(__ptr,close_walk_cb,0);
    puStack_428 = (uv_process_options_t *)0x1c2af1;
    uv_run(__ptr,0);
    lStack_418 = 0;
    puStack_428 = (uv_process_options_t *)0x1c2aff;
    uVar4 = uv_default_loop();
    puStack_428 = (uv_process_options_t *)0x1c2b07;
    iVar1 = uv_loop_close(uVar4);
    lStack_420 = (long)iVar1;
    if (lStack_418 == lStack_420) {
      puStack_428 = (uv_process_options_t *)0x1c2b1d;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    puStack_428 = (uv_process_options_t *)0x1c2b32;
    run_test_spawn_auto_unref_cold_1();
LAB_001c2b32:
    puStack_428 = (uv_process_options_t *)0x1c2b3f;
    run_test_spawn_auto_unref_cold_2();
LAB_001c2b3f:
    puStack_428 = (uv_process_options_t *)0x1c2b4c;
    run_test_spawn_auto_unref_cold_3();
LAB_001c2b4c:
    puStack_428 = (uv_process_options_t *)0x1c2b59;
    run_test_spawn_auto_unref_cold_4();
LAB_001c2b59:
    puStack_428 = (uv_process_options_t *)0x1c2b66;
    run_test_spawn_auto_unref_cold_5();
  }
  puStack_428 = (uv_process_options_t *)run_test_spawn_fs_open;
  run_test_spawn_auto_unref_cold_6();
  uStack_888 = 0x6c756e2f7665642f;
  uStack_880 = 0x6c;
  aStack_430 = (anon_union_8_2_13e1ed65_for_data)__ptr;
  puStack_428 = __s;
  iVar1 = uv_fs_open(0,auStack_5f0,&uStack_888,2,0,0);
  ap_Stack_6d8[0] = (uv_exit_cb)(long)iVar1;
  alStack_7a0[0] = 0;
  if (ap_Stack_6d8[0] == (uv_exit_cb)0x0) {
    iStack_8a0 = iStack_598;
    init_process_options("spawn_helper8",exit_cb);
    uVar4 = uv_default_loop();
    __ptr = (uv_process_options_t *)ap_Stack_6d8;
    iVar1 = uv_pipe_init(uVar4,__ptr,0);
    alStack_7a0[0] = (long)iVar1;
    alStack_868[0] = 0;
    if (alStack_7a0[0] != 0) goto LAB_001c2e8a;
    options.stdio = &uStack_878;
    uStack_878.flags = UV_READABLE_PIPE|UV_CREATE_PIPE;
    options.stdio_count = 1;
    uStack_878.data.stream = (uv_stream_t *)__ptr;
    iStack_89c = dup(iStack_8a0);
    uVar4 = uv_default_loop();
    iVar1 = uv_spawn(uVar4,&process,&options);
    alStack_7a0[0] = (long)iVar1;
    alStack_868[0] = 0;
    if (alStack_7a0[0] != 0) goto LAB_001c2e9c;
    auStack_898 = uv_buf_init(&iStack_8a0,4);
    iVar1 = uv_write(alStack_7a0,ap_Stack_6d8,auStack_898,1,write_null_cb);
    alStack_868[0] = (long)iVar1;
    if (alStack_868[0] != 0) goto LAB_001c2eae;
    auVar12 = uv_buf_init(&iStack_89c,4);
    auStack_898 = auVar12;
    iVar1 = uv_write(alStack_868,ap_Stack_6d8,auStack_898,1,write_cb);
    lStack_8a8 = 0;
    if (iVar1 != 0) goto LAB_001c2ebd;
    uVar4 = uv_default_loop();
    iVar1 = uv_run(uVar4,0);
    lStack_8a8 = 0;
    if (iVar1 != 0) goto LAB_001c2ecc;
    iVar1 = uv_fs_close(0,auStack_5f0,iStack_8a0,0);
    lStack_8a8 = 0;
    if (iVar1 != 0) goto LAB_001c2edb;
    lStack_8a8 = (long)exit_cb_called;
    if (lStack_8a8 != 1) goto LAB_001c2eea;
    lStack_8a8 = (long)close_cb_called;
    if (lStack_8a8 != 2) goto LAB_001c2ef9;
    __ptr = (uv_process_options_t *)uv_default_loop();
    uv_walk(__ptr,close_walk_cb,0);
    uv_run(__ptr,0);
    uVar4 = uv_default_loop();
    iVar1 = uv_loop_close(uVar4);
    lStack_8a8 = (long)iVar1;
    if (lStack_8a8 == 0) {
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    run_test_spawn_fs_open_cold_1();
LAB_001c2e8a:
    run_test_spawn_fs_open_cold_2();
LAB_001c2e9c:
    run_test_spawn_fs_open_cold_3();
LAB_001c2eae:
    run_test_spawn_fs_open_cold_4();
LAB_001c2ebd:
    run_test_spawn_fs_open_cold_5();
LAB_001c2ecc:
    run_test_spawn_fs_open_cold_6();
LAB_001c2edb:
    run_test_spawn_fs_open_cold_7();
LAB_001c2eea:
    run_test_spawn_fs_open_cold_8();
LAB_001c2ef9:
    run_test_spawn_fs_open_cold_9();
  }
  iVar1 = (int)&lStack_8a8;
  run_test_spawn_fs_open_cold_10();
  if (iVar1 == 0) {
    return 0;
  }
  write_null_cb_cold_1();
  aStack_8e0 = (anon_union_8_2_13e1ed65_for_data)__ptr;
  auStack_bf0._24_16_ = uv_buf_init("",1);
  iVar1 = uv_pipe(auStack_bf0 + 0x10,0,0);
  if (iVar1 == 0) {
    init_process_options("spawn_helper4",exit_cb);
    options.stdio_count = 3;
    options.stdio = &uStack_918;
    uStack_918.flags = UV_INHERIT_FD;
    uStack_918.data.file = auStack_bf0._16_4_;
    uStack_908 = 0;
    uStack_8f8 = 0;
    uVar4 = uv_default_loop();
    iVar1 = uv_spawn(uVar4,&process,&options);
    apuStack_bc0[0] = (uv_handle_t *)(long)iVar1;
    auStack_a00[0] = 0;
    if (apuStack_bc0[0] != (uv_handle_t *)0x0) goto LAB_001c33c5;
    uv_unref(&process);
    uVar4 = uv_default_loop();
    iVar1 = uv_pipe_init(uVar4,auStack_a00,0);
    apuStack_bc0[0] = (uv_handle_t *)(long)iVar1;
    auStack_bf0._0_8_ = (uv_loop_t *)0x0;
    if (apuStack_bc0[0] != (uv_handle_t *)0x0) goto LAB_001c33d7;
    iVar1 = uv_pipe_open(auStack_a00,auStack_bf0._16_4_);
    apuStack_bc0[0] = (uv_handle_t *)(long)iVar1;
    auStack_bf0._0_8_ = (uv_loop_t *)0x0;
    if (apuStack_bc0[0] != (uv_handle_t *)0x0) goto LAB_001c33e6;
    auStack_bf0._16_4_ = ~UV_UNKNOWN_HANDLE;
    iVar1 = uv_read_start(auStack_a00,on_alloc,on_read_once);
    apuStack_bc0[0] = (uv_handle_t *)(long)iVar1;
    auStack_bf0._0_8_ = (uv_loop_t *)0x0;
    if (apuStack_bc0[0] != (uv_handle_t *)0x0) goto LAB_001c33f5;
    auStack_bf0._0_8_ = (uv_loop_t *)0x1;
    iVar1 = uv_fs_write(0,apuStack_bc0,auStack_bf0._20_4_,auStack_bf0 + 0x18,1,0xffffffffffffffff,0)
    ;
    auStack_bf0._8_8_ = SEXT48(iVar1);
    if (auStack_bf0._0_8_ != auStack_bf0._8_8_) goto LAB_001c3404;
    auStack_bf0._0_8_ = (uv_loop_t *)0x1;
    auStack_bf0._8_8_ = puStack_b68;
    if (puStack_b68 != (uv_loop_t *)0x1) goto LAB_001c3413;
    uv_fs_req_cleanup(apuStack_bc0);
    uVar4 = uv_default_loop();
    iVar1 = uv_run(uVar4,1);
    auStack_bf0._0_8_ = SEXT48(iVar1);
    auStack_bf0._8_8_ = (uv_loop_t *)0x0;
    if ((uv_loop_t *)auStack_bf0._0_8_ != (uv_loop_t *)0x0) goto LAB_001c3422;
    auStack_bf0._0_8_ = (uv_loop_t *)0x1;
    auStack_bf0._8_8_ = SEXT48(output_used);
    if ((uv_loop_t *)auStack_bf0._8_8_ != (uv_loop_t *)0x1) goto LAB_001c3431;
    uv_close(auStack_a00,close_cb);
    auStack_bf0._0_8_ = (uv_loop_t *)0x1;
    iVar1 = uv_fs_write(0,apuStack_bc0,auStack_bf0._20_4_,auStack_bf0 + 0x18,1,0xffffffffffffffff,0)
    ;
    auStack_bf0._8_8_ = SEXT48(iVar1);
    if (auStack_bf0._0_8_ != auStack_bf0._8_8_) goto LAB_001c3440;
    auStack_bf0._0_8_ = (uv_loop_t *)0x1;
    auStack_bf0._8_8_ = puStack_b68;
    if (puStack_b68 != (uv_loop_t *)0x1) goto LAB_001c344f;
    uv_fs_req_cleanup(apuStack_bc0);
    uVar4 = uv_default_loop();
    iVar1 = uv_timer_init(uVar4,&timer);
    auStack_bf0._0_8_ = SEXT48(iVar1);
    auStack_bf0._8_8_ = (uv_loop_t *)0x0;
    if ((uv_loop_t *)auStack_bf0._0_8_ != (uv_loop_t *)0x0) goto LAB_001c345e;
    iVar1 = uv_timer_start(&timer,timer_counter_cb,10,0);
    auStack_bf0._0_8_ = SEXT48(iVar1);
    auStack_bf0._8_8_ = (uv_loop_t *)0x0;
    if ((uv_loop_t *)auStack_bf0._0_8_ != (uv_loop_t *)0x0) goto LAB_001c346d;
    uVar4 = uv_default_loop();
    iVar1 = uv_run(uVar4,1);
    if (iVar1 == 1) {
      uVar4 = uv_default_loop();
      iVar1 = uv_run(uVar4,1);
      auStack_bf0._0_8_ = SEXT48(iVar1);
      auStack_bf0._8_8_ = (uv_loop_t *)0x0;
      if ((uv_loop_t *)auStack_bf0._0_8_ != (uv_loop_t *)0x0) goto LAB_001c34b8;
    }
    auStack_bf0._0_8_ = (uv_loop_t *)0x1;
    auStack_bf0._8_8_ = SEXT48(timer_counter);
    if ((uv_loop_t *)auStack_bf0._8_8_ != (uv_loop_t *)0x1) goto LAB_001c347c;
    iVar1 = uv_process_kill(&process,0xf);
    auStack_bf0._0_8_ = SEXT48(iVar1);
    auStack_bf0._8_8_ = (uv_loop_t *)0x0;
    if ((uv_loop_t *)auStack_bf0._0_8_ != (uv_loop_t *)0x0) goto LAB_001c348b;
    iVar1 = close(auStack_bf0._20_4_);
    auStack_bf0._0_8_ = SEXT48(iVar1);
    auStack_bf0._8_8_ = (uv_loop_t *)0x0;
    if ((uv_loop_t *)auStack_bf0._0_8_ != (uv_loop_t *)0x0) goto LAB_001c349a;
    auStack_bf0._20_4_ = -1;
    uVar4 = uv_default_loop();
    uv_walk(uVar4,close_walk_cb,0);
    uv_run(uVar4,0);
    auStack_bf0._0_8_ = (uv_loop_t *)0x0;
    uVar4 = uv_default_loop();
    iVar1 = uv_loop_close(uVar4);
    auStack_bf0._8_8_ = SEXT48(iVar1);
    if (auStack_bf0._0_8_ == auStack_bf0._8_8_) {
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    run_test_closed_fd_events_cold_1();
LAB_001c33c5:
    run_test_closed_fd_events_cold_2();
LAB_001c33d7:
    run_test_closed_fd_events_cold_3();
LAB_001c33e6:
    run_test_closed_fd_events_cold_4();
LAB_001c33f5:
    run_test_closed_fd_events_cold_5();
LAB_001c3404:
    run_test_closed_fd_events_cold_6();
LAB_001c3413:
    run_test_closed_fd_events_cold_7();
LAB_001c3422:
    run_test_closed_fd_events_cold_8();
LAB_001c3431:
    run_test_closed_fd_events_cold_9();
LAB_001c3440:
    run_test_closed_fd_events_cold_10();
LAB_001c344f:
    run_test_closed_fd_events_cold_11();
LAB_001c345e:
    run_test_closed_fd_events_cold_12();
LAB_001c346d:
    run_test_closed_fd_events_cold_13();
LAB_001c347c:
    run_test_closed_fd_events_cold_15();
LAB_001c348b:
    run_test_closed_fd_events_cold_16();
LAB_001c349a:
    run_test_closed_fd_events_cold_17();
  }
  run_test_closed_fd_events_cold_18();
LAB_001c34b8:
  tcp = (uv_stream_t *)auStack_bf0;
  nread = auStack_bf0 + 8;
  run_test_closed_fd_events_cold_14();
  uv_read_stop();
  on_read(tcp,(ssize_t)nread,buf);
  return extraout_EAX;
}

Assistant:

TEST_IMPL(spawn_closed_process_io) {
  uv_pipe_t in;
  uv_write_t write_req;
  uv_buf_t buf;
  uv_stdio_container_t stdio[2];
  static char buffer[] = "hello-from-spawn_stdin\n";

  init_process_options("spawn_helper3", exit_cb);

  uv_pipe_init(uv_default_loop(), &in, 0);
  options.stdio = stdio;
  options.stdio[0].flags = UV_CREATE_PIPE | UV_READABLE_PIPE;
  options.stdio[0].data.stream = (uv_stream_t*) &in;
  options.stdio_count = 1;

  close(0); /* Close process stdin. */

  ASSERT_OK(uv_spawn(uv_default_loop(), &process, &options));

  buf = uv_buf_init(buffer, sizeof(buffer));
  ASSERT_OK(uv_write(&write_req, (uv_stream_t*) &in, &buf, 1, write_cb));

  ASSERT_OK(uv_run(uv_default_loop(), UV_RUN_DEFAULT));

  ASSERT_EQ(1, exit_cb_called);
  ASSERT_EQ(2, close_cb_called); /* process, child stdin */

  MAKE_VALGRIND_HAPPY(uv_default_loop());
  return 0;
}